

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O1

Error * ot::commissioner::Ipv6PrefixFromString
                  (Error *__return_storage_ptr__,ByteArray *aPrefix,string *aStr)

{
  string *this;
  ErrorCode EVar1;
  bool bVar2;
  long lVar3;
  ulonglong __new_size;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Address addr;
  char *endPtr;
  string local_d8;
  undefined1 local_b8 [8];
  undefined1 *local_b0;
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  ByteArray *local_90;
  Address local_88;
  undefined1 local_68 [8];
  char *pcStack_60;
  size_t local_58;
  char local_50 [8];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  code *local_40;
  char *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_88.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90 = aPrefix;
  lVar3 = std::__cxx11::string::find((char)aStr,0x2f);
  if (lVar3 == -1) {
    local_68._0_4_ = string_type;
    pcStack_60 = "{} is not a valid IPv6 prefix";
    local_58 = 0x1d;
    local_50 = (char  [8])0x100000000;
    local_40 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar5 = "{} is not a valid IPv6 prefix";
    local_48 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    local_68 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
    pcStack_60 = (char *)aStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1d;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_d8,(v10 *)"{} is not a valid IPv6 prefix",fmt,args);
    local_b8._0_4_ = kInvalidArgs;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
  }
  else {
    local_38 = (pointer)0x0;
    __new_size = strtoull((aStr->_M_dataplus)._M_p + lVar3 + 1,&local_38,0);
    if ((local_38 == (pointer)0x0) || (local_38 <= (aStr->_M_dataplus)._M_p + lVar3 + 1)) {
      local_68._0_4_ = string_type;
      pcStack_60 = "{} is not a valid IPv6 prefix";
      local_58 = 0x1d;
      local_50 = (char  [8])0x100000000;
      local_40 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar5 = "{} is not a valid IPv6 prefix";
      local_48 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_68;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_68);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_68 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      pcStack_60 = (char *)aStr->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1d;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_d8,(v10 *)"{} is not a valid IPv6 prefix",fmt_00,args_00);
      local_b8._0_4_ = kInvalidArgs;
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
LAB_00144fc9:
      __return_storage_ptr__->mCode = local_b8._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_b0);
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      bVar2 = false;
    }
    else {
      if (0x80 < __new_size) {
        local_68._0_4_ = string_type;
        pcStack_60 = "{} is not a valid IPv6 prefix";
        local_58 = 0x1d;
        local_50 = (char  [8])0x100000000;
        local_40 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar5 = "{} is not a valid IPv6 prefix";
        local_48 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_68;
        do {
          pcVar4 = pcVar5 + 1;
          if (*pcVar5 == '}') {
            if ((pcVar4 == "") || (*pcVar4 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar4 = pcVar5 + 2;
          }
          else if (*pcVar5 == '{') {
            pcVar4 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar5,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_68);
          }
          pcVar5 = pcVar4;
        } while (pcVar4 != "");
        local_68 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
        pcStack_60 = (char *)aStr->_M_string_length;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x1d;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_68;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_d8,(v10 *)"{} is not a valid IPv6 prefix",fmt_01,args_01);
        local_b8._0_4_ = kInvalidArgs;
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_d8._M_dataplus._M_p,
                   local_d8._M_dataplus._M_p + local_d8._M_string_length);
        goto LAB_00144fc9;
      }
      __new_size = __new_size >> 3;
      bVar2 = true;
    }
    if (!bVar2) goto LAB_001450aa;
    std::__cxx11::string::substr((ulong)local_b8,(ulong)aStr);
    Address::Set((Error *)local_68,&local_88,(string *)local_b8);
    __return_storage_ptr__->mCode = local_68._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&pcStack_60);
    EVar1 = __return_storage_ptr__->mCode;
    if (pcStack_60 != local_50) {
      operator_delete(pcStack_60);
    }
    if ((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != local_a8) {
      operator_delete((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
    }
    if (EVar1 != kNone) goto LAB_001450aa;
    if ((long)local_88.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_88.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (local_90,&local_88.mBytes);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_90,__new_size);
      goto LAB_001450aa;
    }
    local_68._0_4_ = string_type;
    pcStack_60 = "{} is not a valid IPv6 prefix";
    local_58 = 0x1d;
    local_50 = (char  [8])0x100000000;
    local_40 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar5 = "{} is not a valid IPv6 prefix";
    local_48 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    local_68 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
    pcStack_60 = (char *)aStr->_M_string_length;
    fmt_02.size_ = 0xd;
    fmt_02.data_ = (char *)0x1d;
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_d8,(v10 *)"{} is not a valid IPv6 prefix",fmt_02,args_02);
    local_b8._0_4_ = kInvalidArgs;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
  }
  __return_storage_ptr__->mCode = local_b8._0_4_;
  std::__cxx11::string::operator=((string *)this,(string *)&local_b0);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
LAB_001450aa:
  if (local_88.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Ipv6PrefixFromString(ByteArray &aPrefix, const std::string &aStr)
{
    Error   error;
    size_t  slash;
    size_t  prefixLength;
    Address addr;

    slash = aStr.find('/');
    VerifyOrExit(slash != std::string::npos, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    {
        char *endPtr = nullptr;
        prefixLength = strtoull(&aStr[slash + 1], &endPtr, 0);
        VerifyOrExit(endPtr != nullptr && endPtr > &aStr[slash + 1],
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        VerifyOrExit(prefixLength <= 128, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        prefixLength /= 8;
    }

    SuccessOrExit(error = addr.Set(aStr.substr(0, slash)));
    VerifyOrExit(addr.IsIpv6(), error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    aPrefix = addr.GetRaw();
    aPrefix.resize(prefixLength);

exit:
    return error;
}